

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O2

bool MeCab::CharProperty::compile(char *cfile,char *ufile,char *ofile)

{
  char **ppcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  CharInfo CVar5;
  ostream *poVar6;
  long *plVar7;
  size_t sVar8;
  iterator iVar9;
  long lVar10;
  pointer __result;
  pointer pRVar11;
  iterator iVar12;
  _Base_ptr p_Var13;
  _Tp_alloc_type *__alloc;
  pointer pCVar14;
  Range *extraout_RDX;
  Range *extraout_RDX_00;
  Range *extraout_RDX_01;
  Range *extraout_RDX_02;
  Range *__args;
  istringstream *piVar15;
  char *pcVar16;
  pointer pRVar17;
  pointer pbVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pRVar21;
  ulong uVar22;
  uint local_a7c;
  scoped_fixed_array<char_*,_512> col;
  scoped_fixed_array<char,_8192> line;
  vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  range;
  uint size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> table;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
  category;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  category_ary;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unk;
  string key;
  byte abStack_920 [480];
  ifstream ifs2;
  CharInfo local_720;
  istringstream iss2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_530 [15];
  ifstream ifs;
  byte abStack_398 [488];
  istringstream iss;
  
  line._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_00138e90;
  line.ptr_ = (char *)operator_new__(0x2000);
  line.size_ = 0x2000;
  col._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_00138f80;
  col.ptr_ = (char **)operator_new__(0x1000);
  col.size_ = 0x200;
  range.
  super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  range.
  super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  range.
  super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  category._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &category._M_t._M_impl.super__Rb_tree_header._M_header;
  category._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  category._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  category._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  category_ary.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  category_ary.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  category_ary.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  category._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       category._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::ifstream::ifstream((istringstream *)&ifs,cfile,_S_in);
  std::__cxx11::string::string
            ((string *)&ifs2,"DEFAULT 1 0 0\nSPACE   0 1 0\n0x0020 SPACE\n",(allocator *)&key);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&ifs2,_S_in);
  std::__cxx11::string::~string((string *)&ifs2);
  piVar15 = (istringstream *)&ifs;
  if ((abStack_398[*(long *)(_ifs + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,cfile);
    poVar6 = std::operator<<(poVar6," is not found. minimum setting is used");
    std::endl<char,std::char_traits<char>>(poVar6);
    piVar15 = (istringstream *)&iss;
  }
  pRVar17 = (pointer)0x0;
  local_a7c = 0;
  do {
    while( true ) {
      do {
        plVar7 = (long *)std::istream::getline((char *)piVar15,(long)line.ptr_);
        if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
          if (0x11 < category._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xcd);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"category.size() < 18");
            poVar6 = std::operator<<(poVar6,"] ");
            std::operator<<(poVar6,"too many categories(>= 18)");
            die::~die((die *)&ifs2);
          }
          std::__cxx11::string::string((string *)&ifs2,"DEFAULT",(allocator *)&key);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                  ::find(&category._M_t,(key_type *)&ifs2);
          if ((_Rb_tree_header *)iVar9._M_node == &category._M_t._M_impl.super__Rb_tree_header) {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xcf);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"category.find(\"DEFAULT\") != category.end()");
            poVar6 = std::operator<<(poVar6,"] ");
            std::operator<<(poVar6,"category [DEFAULT] is undefined");
            die::~die((die *)&iss2);
          }
          std::__cxx11::string::~string((string *)&ifs2);
          std::__cxx11::string::string((string *)&ifs2,"SPACE",(allocator *)&key);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                  ::find(&category._M_t,(key_type *)&ifs2);
          if ((_Rb_tree_header *)iVar9._M_node == &category._M_t._M_impl.super__Rb_tree_header) {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd2);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"category.find(\"SPACE\") != category.end()");
            poVar6 = std::operator<<(poVar6,"] ");
            std::operator<<(poVar6,"category [SPACE] is undefined");
            die::~die((die *)&iss2);
          }
          std::__cxx11::string::~string((string *)&ifs2);
          std::__cxx11::string::string
                    ((string *)&ifs2,"DEFAULT,0,0,0,*\nSPACE,0,0,0,*\n",(allocator *)&key);
          std::__cxx11::istringstream::istringstream((istringstream *)&iss2,(string *)&ifs2,_S_in);
          std::__cxx11::string::~string((string *)&ifs2);
          std::ifstream::ifstream((istringstream *)&ifs2,ufile,_S_in);
          piVar15 = (istringstream *)&ifs2;
          if (((&local_720.field_0x0)[*(long *)(_ifs2 + -0x18)] & 5) != 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,ufile);
            poVar6 = std::operator<<(poVar6," is not found. minimum setting is used.");
            std::endl<char,std::char_traits<char>>(poVar6);
            piVar15 = (istringstream *)&iss2;
          }
          unk._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &unk._M_t._M_impl.super__Rb_tree_header._M_header;
          unk._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          unk._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          unk._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          unk._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               unk._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            plVar7 = (long *)std::istream::getline((char *)piVar15,(long)line.ptr_);
            if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) break;
            sVar8 = tokenizeCSV<char**>(line.ptr_,col.ptr_,2);
            if (sVar8 == 0) {
              poVar6 = std::operator<<((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                      );
              poVar6 = std::operator<<(poVar6,"(");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe2);
              poVar6 = std::operator<<(poVar6,") [");
              poVar6 = std::operator<<(poVar6,"n >= 1");
              poVar6 = std::operator<<(poVar6,"] ");
              poVar6 = std::operator<<(poVar6,"format error: ");
              std::operator<<(poVar6,line.ptr_);
              die::~die((die *)&key);
            }
            std::__cxx11::string::string((string *)&key,*col.ptr_,(allocator *)&tmp);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                    ::find(&category._M_t,&key);
            if ((_Rb_tree_header *)iVar9._M_node == &category._M_t._M_impl.super__Rb_tree_header) {
              poVar6 = std::operator<<((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                      );
              poVar6 = std::operator<<(poVar6,"(");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe4);
              poVar6 = std::operator<<(poVar6,") [");
              poVar6 = std::operator<<(poVar6,"category.find(key) != category.end()");
              poVar6 = std::operator<<(poVar6,"] ");
              poVar6 = std::operator<<(poVar6,"category [");
              poVar6 = std::operator<<(poVar6,(string *)&key);
              poVar6 = std::operator<<(poVar6,"] is undefined in ");
              std::operator<<(poVar6,cfile);
              die::~die((die *)&tmp);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&unk,&key);
            std::__cxx11::string::~string((string *)&key);
          }
          for (p_Var13 = category._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var13 != &category._M_t._M_impl.super__Rb_tree_header;
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&unk._M_t,(key_type *)(p_Var13 + 1));
            if ((_Rb_tree_header *)iVar12._M_node == &unk._M_t._M_impl.super__Rb_tree_header) {
              poVar6 = std::operator<<((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                      );
              poVar6 = std::operator<<(poVar6,"(");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xec);
              poVar6 = std::operator<<(poVar6,") [");
              poVar6 = std::operator<<(poVar6,"unk.find(it->first) != unk.end()");
              poVar6 = std::operator<<(poVar6,"] ");
              poVar6 = std::operator<<(poVar6,"category [");
              poVar6 = std::operator<<(poVar6,(string *)(p_Var13 + 1));
              poVar6 = std::operator<<(poVar6,"] is undefined in ");
              std::operator<<(poVar6,ufile);
              die::~die((die *)&key);
            }
          }
          std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::vector
                    (&table,0xffff,(allocator_type *)&key);
          tmp.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          tmp.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          tmp.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&key,"DEFAULT",(allocator *)&size);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tmp,&key)
          ;
          std::__cxx11::string::~string((string *)&key);
          CVar5 = anon_unknown_3::encode(&tmp,&category);
          for (pCVar14 = table.super__Vector_base<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pCVar14 !=
              table.super__Vector_base<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>._M_impl.
              super__Vector_impl_data._M_finish; pCVar14 = pCVar14 + 1) {
            *pCVar14 = CVar5;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&tmp);
          pRVar17 = range.
                    super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pRVar21 = range.
                         super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                         ._M_impl.super__Vector_impl_data._M_start; pRVar21 != pRVar17;
              pRVar21 = pRVar21 + 1) {
            CVar5 = anon_unknown_3::encode(&pRVar21->c,&category);
            for (lVar10 = (long)pRVar21->low; lVar10 <= pRVar21->high; lVar10 = lVar10 + 1) {
              table.super__Vector_base<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] = CVar5;
            }
          }
          std::ofstream::ofstream(&key,ofile,_S_out|_S_bin);
          if ((abStack_920[*(long *)(key._M_dataplus._M_p + -0x18)] & 5) != 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x104);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"ofs");
            poVar6 = std::operator<<(poVar6,"] ");
            poVar6 = std::operator<<(poVar6,"permission denied: ");
            std::operator<<(poVar6,ofile);
            die::~die((die *)&tmp);
          }
          size = (uint)category._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::ostream::write((char *)&key,(long)&size);
          for (pbVar18 = category_ary.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pbVar18 !=
              category_ary.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar18 = pbVar18 + 1) {
            tmp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            tmp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            tmp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            strncpy((char *)&tmp,(pbVar18->_M_dataplus)._M_p,0x1f);
            std::ostream::write((char *)&key,(long)&tmp);
          }
          std::ostream::write((char *)&key,
                              (long)table.
                                    super__Vector_base<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          std::ofstream::close();
          std::ofstream::~ofstream(&key);
          std::_Vector_base<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::~_Vector_base
                    (&table.super__Vector_base<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&unk._M_t);
          std::ifstream::~ifstream(&ifs2);
          std::__cxx11::istringstream::~istringstream((istringstream *)&iss2);
          std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
          std::ifstream::~ifstream(&ifs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&category_ary);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
          ::~_Rb_tree(&category._M_t);
          std::
          vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
          ::~vector(&range);
          scoped_fixed_array<char_*,_512>::~scoped_fixed_array(&col);
          scoped_fixed_array<char,_8192>::~scoped_fixed_array(&line);
          return true;
        }
      } while ((*line.ptr_ == '\0') || (*line.ptr_ == '#'));
      sVar8 = tokenize2<char**>(line.ptr_,"\t ",col.ptr_,col.size_);
      if (sVar8 < 2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x99);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"size >= 2");
        poVar6 = std::operator<<(poVar6,"] ");
        poVar6 = std::operator<<(poVar6,"format error: ");
        std::operator<<(poVar6,line.ptr_);
        die::~die((die *)&ifs2);
      }
      pcVar16 = *col.ptr_;
      if ((*pcVar16 == '0') && (pcVar16[1] == 'x')) break;
      if (sVar8 < 4) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xbb);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"size >= 4");
        poVar6 = std::operator<<(poVar6,"] ");
        poVar6 = std::operator<<(poVar6,"format error: ");
        std::operator<<(poVar6,line.ptr_);
        die::~die((die *)&ifs2);
        pcVar16 = *col.ptr_;
      }
      std::__cxx11::string::string((string *)&key,pcVar16,(allocator *)&ifs2);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
              ::find(&category._M_t,&key);
      if ((_Rb_tree_header *)iVar9._M_node != &category._M_t._M_impl.super__Rb_tree_header) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xbe);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"category.find(key) == category.end()");
        poVar6 = std::operator<<(poVar6,"] ");
        poVar6 = std::operator<<(poVar6,"category ");
        poVar6 = std::operator<<(poVar6,(string *)&key);
        std::operator<<(poVar6," is already defined");
        die::~die((die *)&ifs2);
      }
      ppcVar1 = col.ptr_;
      iVar2 = atoi(col.ptr_[1]);
      uVar3 = atoi(ppcVar1[2]);
      uVar4 = atoi(ppcVar1[3]);
      std::__cxx11::string::string((string *)&ifs2,(string *)&key);
      local_720 = (CharInfo)
                  ((local_a7c & 0xff) << 0x12 |
                  (uVar4 & 0xf) << 0x1a | (uVar3 & 1) << 0x1e | iVar2 << 0x1f);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MeCab::CharInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,MeCab::CharInfo>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MeCab::CharInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>>
                  *)&category,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
                  *)&ifs2);
      std::__cxx11::string::~string((string *)&ifs2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&category_ary,&key);
      local_a7c = local_a7c + 1;
      std::__cxx11::string::~string((string *)&key);
    }
    std::__cxx11::string::string((string *)&ifs2,pcVar16,(allocator *)&key);
    key._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    key._M_dataplus._M_p = (pointer)&key.field_2;
    lVar10 = std::__cxx11::string::find((char *)&ifs2,0x1276de);
    if (lVar10 == -1) {
      std::__cxx11::string::_M_assign((string *)&key);
    }
    else {
      std::__cxx11::string::substr((ulong)&iss2,(ulong)&ifs2);
      std::__cxx11::string::operator=((string *)&key,(string *)&iss2);
      std::__cxx11::string::~string((string *)&iss2);
      std::__cxx11::string::substr((ulong)&iss2,(ulong)&ifs2);
      std::__cxx11::string::operator=((string *)&ifs2,(string *)&iss2);
      std::__cxx11::string::~string((string *)&iss2);
    }
    local_530[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_530[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_530[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _iss2 = anon_unknown_3::atohex(_ifs2);
    uVar3 = anon_unknown_3::atohex(key._M_dataplus._M_p);
    if ((((int)uVar3 < (int)_iss2) || (0xfffe < uVar3)) || (__args = extraout_RDX, 0xfffe < _iss2))
    {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                              );
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xae);
      poVar6 = std::operator<<(poVar6,") [");
      poVar6 = std::operator<<(poVar6,
                               "r.low >= 0 && r.low < 0xffff && r.high >= 0 && r.high < 0xffff && r.low <= r.high"
                              );
      poVar6 = std::operator<<(poVar6,"] ");
      poVar6 = std::operator<<(poVar6,"range error: low=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,_iss2);
      poVar6 = std::operator<<(poVar6," high=");
      std::ostream::operator<<(poVar6,uVar3);
      die::~die((die *)&unk);
      __args = extraout_RDX_00;
    }
    for (uVar19 = 1;
        (pRVar21 = range.
                   super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                   ._M_impl.super__Vector_impl_data._M_start, uVar19 < sVar8 &&
        (*col.ptr_[uVar19] != '#')); uVar19 = uVar19 + 1) {
      std::__cxx11::string::string((string *)&unk,col.ptr_[uVar19],(allocator *)&tmp);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
              ::find(&category._M_t,(key_type *)&unk);
      if ((_Rb_tree_header *)iVar9._M_node == &category._M_t._M_impl.super__Rb_tree_header) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb5);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"category.find(std::string(col[i])) != category.end()");
        poVar6 = std::operator<<(poVar6,"] ");
        poVar6 = std::operator<<(poVar6,"category [");
        poVar6 = std::operator<<(poVar6,col.ptr_[uVar19]);
        std::operator<<(poVar6,"] is undefined");
        die::~die((die *)&table);
      }
      std::__cxx11::string::~string((string *)&unk);
      std::__cxx11::string::string((string *)&unk,col.ptr_[uVar19],(allocator *)&tmp);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_530,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unk);
      std::__cxx11::string::~string((string *)&unk);
      __args = extraout_RDX_01;
    }
    if (pRVar17 ==
        range.
        super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)pRVar17 -
          (long)range.
                super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar22 = (long)pRVar17 -
               (long)range.
                     super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar19 = uVar22;
      if (pRVar17 ==
          range.
          super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar19 = 1;
      }
      uVar20 = uVar19 + uVar22;
      __alloc = (_Tp_alloc_type *)0x3ffffffffffffff;
      if (0x3fffffffffffffe < uVar20) {
        uVar20 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar19,uVar22)) {
        uVar20 = 0x3ffffffffffffff;
      }
      if (uVar20 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar20 << 5);
        __args = extraout_RDX_02;
      }
      std::allocator_traits<std::allocator<MeCab::(anonymous_namespace)::Range>>::
      construct<MeCab::(anonymous_namespace)::Range,MeCab::(anonymous_namespace)::Range_const&>
                ((allocator_type *)(__result + uVar22),(Range *)&iss2,__args);
      pRVar11 = std::
                vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                ::_S_relocate(pRVar21,pRVar17,__result,__alloc);
      pRVar11 = std::
                vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                ::_S_relocate(pRVar17,pRVar17,pRVar11 + 1,__alloc);
      if (pRVar21 != (pointer)0x0) {
        operator_delete(pRVar21);
      }
      range.
      super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar20;
      range.
      super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      range.
      super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar11;
    }
    else {
      std::allocator_traits<std::allocator<MeCab::(anonymous_namespace)::Range>>::
      construct<MeCab::(anonymous_namespace)::Range,MeCab::(anonymous_namespace)::Range_const&>
                ((allocator_type *)pRVar17,(Range *)&iss2,__args);
      range.
      super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar17 + 1;
    }
    pRVar17 = range.
              super__Vector_base<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_530);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&ifs2);
  } while( true );
}

Assistant:

bool CharProperty::compile(const char *cfile,
                           const char *ufile,
                           const char *ofile) {
  scoped_fixed_array<char, BUF_SIZE> line;
  scoped_fixed_array<char *, 512> col;
  size_t id = 0;
  std::vector<Range> range;
  std::map<std::string, CharInfo> category;
  std::vector<std::string> category_ary;
  std::ifstream ifs(WPATH(cfile));
  std::istringstream iss(CHAR_PROPERTY_DEF_DEFAULT);
  std::istream *is = &ifs;

  if (!ifs) {
    std::cerr << cfile
              << " is not found. minimum setting is used" << std::endl;
    is = &iss;
  }

  while (is->getline(line.get(), line.size())) {
    if (std::strlen(line.get()) == 0 || line[0] == '#') {
      continue;
    }
    const size_t size = tokenize2(line.get(), "\t ", col.get(), col.size());
    CHECK_DIE(size >= 2) << "format error: " << line.get();

    // 0xFFFF..0xFFFF hoge hoge hgoe #
    if (std::strncmp(col[0], "0x", 2) == 0) {
      std::string low = col[0];
      std::string high;
      size_t pos = low.find("..");

      if (pos != std::string::npos) {
        high = low.substr(pos + 2, low.size() - pos - 2);
        low  = low.substr(0, pos);
      } else {
        high = low;
      }

      Range r;
      r.low = atohex(low.c_str());
      r.high = atohex(high.c_str());

      CHECK_DIE(r.low >= 0 && r.low < 0xffff &&
                r.high >= 0 && r.high < 0xffff &&
                r.low <= r.high)
          << "range error: low=" << r.low << " high=" << r.high;

      for (size_t i = 1; i < size; ++i) {
        if (col[i][0] == '#') {
          break;  // skip comments
        }
        CHECK_DIE(category.find(std::string(col[i])) != category.end())
            << "category [" << col[i] << "] is undefined";
        r.c.push_back(col[i]);
      }
      range.push_back(r);
    } else {
      CHECK_DIE(size >= 4) << "format error: " << line.get();

      std::string key = col[0];
      CHECK_DIE(category.find(key) == category.end())
          << "category " << key << " is already defined";

      CharInfo c;
      std::memset(&c, 0, sizeof(c));
      c.invoke  = std::atoi(col[1]);
      c.group   = std::atoi(col[2]);
      c.length  = std::atoi(col[3]);
      c.default_type = id++;

      category.insert(std::pair<std::string, CharInfo>(key, c));
      category_ary.push_back(key);
    }
  }

  CHECK_DIE(category.size() < 18) << "too many categories(>= 18)";

  CHECK_DIE(category.find("DEFAULT") != category.end())
      << "category [DEFAULT] is undefined";

  CHECK_DIE(category.find("SPACE") != category.end())
      << "category [SPACE] is undefined";

  std::istringstream iss2(UNK_DEF_DEFAULT);
  std::ifstream ifs2(WPATH(ufile));
  std::istream *is2 = &ifs2;

  if (!ifs2) {
    std::cerr << ufile
              << " is not found. minimum setting is used." << std::endl;
    is2 = &iss2;
  }

  std::set<std::string> unk;
  while (is2->getline(line.get(), line.size())) {
    const size_t n = tokenizeCSV(line.get(), col.get(), 2);
    CHECK_DIE(n >= 1) << "format error: " << line.get();
    const std::string key = col[0];
    CHECK_DIE(category.find(key) != category.end())
        << "category [" << key << "] is undefined in " << cfile;
    unk.insert(key);
  }

  for (std::map<std::string, CharInfo>::const_iterator it = category.begin();
       it != category.end();
       ++it) {
    CHECK_DIE(unk.find(it->first) != unk.end())
        << "category [" << it->first << "] is undefined in " << ufile;
  }

  std::vector<CharInfo> table(0xffff);
  {
    std::vector<std::string> tmp;
    tmp.push_back("DEFAULT");
    const CharInfo c = encode(tmp, &category);
    std::fill(table.begin(), table.end(), c);
  }

  for (std::vector<Range>::const_iterator it = range.begin();
       it != range.end();
       ++it) {
    const CharInfo c = encode(it->c, &category);
    for (int i = it->low; i <= it->high; ++i) {
      table[i] = c;
    }
  }

  // output binary table
  {
    std::ofstream ofs(WPATH(ofile), std::ios::binary|std::ios::out);
    CHECK_DIE(ofs) << "permission denied: " << ofile;

    unsigned int size = static_cast<unsigned int>(category.size());
    ofs.write(reinterpret_cast<const char*>(&size), sizeof(size));
    for (std::vector<std::string>::const_iterator it = category_ary.begin();
         it != category_ary.end();
         ++it) {
      char buf[32];
      std::fill(buf, buf + sizeof(buf), '\0');
      std::strncpy(buf, it->c_str(), sizeof(buf) - 1);
      ofs.write(reinterpret_cast<const char*>(buf), sizeof(buf));
    }
    ofs.write(reinterpret_cast<const char*>(&table[0]),
              sizeof(CharInfo) * table.size());
    ofs.close();
  }

  return true;
}